

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

void __thiscall
OpenMD::Snapshot::Snapshot
          (Snapshot *this,int nAtoms,int nRigidbodies,int nCutoffGroups,int atomStorageLayout,
          int rigidBodyStorageLayout,int cutoffGroupStorageLayout,bool usePBC)

{
  long in_RDI;
  Snapshot *this_00;
  Vector3<double> *this_01;
  pair<double,_double> pVar1;
  byte in_stack_00000010;
  SquareMatrix3<double> *in_stack_fffffffffffffca8;
  SquareMatrix3<double> *in_stack_fffffffffffffcb0;
  Vector<double,_7U> *in_stack_fffffffffffffcb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd54;
  size_t in_stack_fffffffffffffd58;
  DataStorage *in_stack_fffffffffffffd60;
  pair<double,_double> local_220;
  double local_210;
  Vector<double,_7U> local_208;
  double local_1d0;
  Vector<double,_7U> local_1c8;
  double local_190;
  Vector<double,_7U> local_188 [6];
  byte local_1d;
  
  local_1d = in_stack_00000010 & 1;
  DataStorage::DataStorage
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
  DataStorage::DataStorage
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
  DataStorage::DataStorage
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
  FrameData::FrameData((FrameData *)in_stack_fffffffffffffd00._M_pi);
  *(undefined8 *)(in_RDI + 0xa90) = 0x3eb0c6f7a0b5ed8d;
  *(undefined4 *)(in_RDI + 0x540) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x548) = 0;
  SquareMatrix3<double>::SquareMatrix3(in_stack_fffffffffffffcb0,(double)in_stack_fffffffffffffca8);
  SquareMatrix3<double>::operator=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x239660);
  SquareMatrix3<double>::SquareMatrix3(in_stack_fffffffffffffcb0,(double)in_stack_fffffffffffffca8);
  SquareMatrix3<double>::operator=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x23969a);
  SquareMatrix3<double>::SquareMatrix3(in_stack_fffffffffffffcb0,(double)in_stack_fffffffffffffca8);
  SquareMatrix3<double>::operator=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2396d4);
  SquareMatrix3<double>::SquareMatrix3(in_stack_fffffffffffffcb0,(double)in_stack_fffffffffffffca8);
  SquareMatrix3<double>::operator=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x23970e);
  *(undefined1 *)(in_RDI + 0x671) = 0;
  *(byte *)(in_RDI + 0x670) = local_1d & 1;
  *(undefined8 *)(in_RDI + 0x6c8) = 0;
  *(undefined8 *)(in_RDI + 0x6d0) = 0;
  *(undefined8 *)(in_RDI + 0x6d8) = 0;
  *(undefined8 *)(in_RDI + 0x6e0) = 0;
  local_190 = 0.0;
  Vector<double,_7U>::Vector(local_188,&local_190);
  Vector<double,_7U>::operator=
            (in_stack_fffffffffffffcb8,(Vector<double,_7U> *)in_stack_fffffffffffffcb0);
  *(undefined8 *)(in_RDI + 0x6c0) = 0;
  *(undefined8 *)(in_RDI + 0x6b8) = 0;
  local_1d0 = 0.0;
  Vector<double,_7U>::Vector(&local_1c8,&local_1d0);
  Vector<double,_7U>::operator=
            (in_stack_fffffffffffffcb8,(Vector<double,_7U> *)in_stack_fffffffffffffcb0);
  local_210 = 0.0;
  Vector<double,_7U>::Vector(&local_208,&local_210);
  Vector<double,_7U>::operator=
            (in_stack_fffffffffffffcb8,(Vector<double,_7U> *)in_stack_fffffffffffffcb0);
  *(undefined8 *)(in_RDI + 0x7a0) = 0;
  *(undefined8 *)(in_RDI + 0x7a8) = 0;
  *(undefined8 *)(in_RDI + 0x7e8) = 0;
  *(undefined8 *)(in_RDI + 0x7f0) = 0;
  *(undefined8 *)(in_RDI + 0x7f8) = 0;
  *(undefined8 *)(in_RDI + 0x800) = 0;
  local_220 = std::make_pair<double,double>
                        ((double *)in_stack_fffffffffffffcb0,(double *)in_stack_fffffffffffffca8);
  this_01 = (Vector3<double> *)local_220.second;
  std::pair<double,_double>::operator=((pair<double,_double> *)(in_RDI + 0x818),&local_220);
  pVar1 = std::make_pair<double,double>
                    ((double *)in_stack_fffffffffffffcb0,(double *)in_stack_fffffffffffffca8);
  this_00 = (Snapshot *)pVar1.first;
  std::pair<double,_double>::operator=
            ((pair<double,_double> *)(in_RDI + 0x840),(type)&stack0xfffffffffffffdc0);
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)pVar1.second,(double)in_stack_fffffffffffffca8);
  SquareMatrix3<double>::operator=((SquareMatrix3<double> *)pVar1.second,in_stack_fffffffffffffca8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x239990);
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)pVar1.second,(double)in_stack_fffffffffffffca8);
  SquareMatrix3<double>::operator=((SquareMatrix3<double> *)pVar1.second,in_stack_fffffffffffffca8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2399c1);
  Vector3<double>::Vector3(this_01,pVar1.first,pVar1.second,(double)in_stack_fffffffffffffca8);
  Vector3<double>::operator=
            ((Vector3<double> *)pVar1.second,(Vector3<double> *)in_stack_fffffffffffffca8);
  std::make_shared<OpenMD::SPFData>();
  std::shared_ptr<OpenMD::SPFData>::operator=
            ((shared_ptr<OpenMD::SPFData> *)pVar1.second,
             (shared_ptr<OpenMD::SPFData> *)&stack0xfffffffffffffcf8);
  std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x239a1d);
  clearDerivedProperties(this_00);
  return;
}

Assistant:

Snapshot::Snapshot(int nAtoms, int nRigidbodies, int nCutoffGroups,
                     int atomStorageLayout, int rigidBodyStorageLayout,
                     int cutoffGroupStorageLayout, bool usePBC) :
      atomData(nAtoms, atomStorageLayout),
      rigidbodyData(nRigidbodies, rigidBodyStorageLayout),
      cgData(nCutoffGroups, cutoffGroupStorageLayout), orthoTolerance_(1e-6) {
    frameData.id                   = -1;
    frameData.currentTime          = 0;
    frameData.hmat                 = Mat3x3d(0.0);
    frameData.invHmat              = Mat3x3d(0.0);
    frameData.bBox                 = Mat3x3d(0.0);
    frameData.invBbox              = Mat3x3d(0.0);
    frameData.orthoRhombic         = false;
    frameData.usePBC               = usePBC;
    frameData.bondPotential        = 0.0;
    frameData.bendPotential        = 0.0;
    frameData.torsionPotential     = 0.0;
    frameData.inversionPotential   = 0.0;
    frameData.lrPotentials         = potVec(0.0);
    frameData.surfacePotential     = 0.0;
    frameData.reciprocalPotential  = 0.0;
    frameData.selfPotentials       = potVec(0.0);
    frameData.excludedPotentials   = potVec(0.0);
    frameData.restraintPotential   = 0.0;
    frameData.rawPotential         = 0.0;
    frameData.xyArea               = 0.0;
    frameData.xzArea               = 0.0;
    frameData.yzArea               = 0.0;
    frameData.volume               = 0.0;
    frameData.thermostat           = make_pair(0.0, 0.0);
    frameData.electronicThermostat = make_pair(0.0, 0.0);
    frameData.barostat             = Mat3x3d(0.0);
    frameData.virialTensor         = Mat3x3d(0.0);
    frameData.conductiveHeatFlux   = Vector3d(0.0, 0.0, 0.0);
    frameData.spfData              = std::make_shared<SPFData>();

    clearDerivedProperties();
  }